

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.h
# Opt level: O0

ProfileId __thiscall
FuncInfo::FindOrAddSlotProfileId(FuncInfo *this,Scope *scope,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *this_00;
  unsigned_short local_32;
  undefined1 auStack_30 [6];
  ProfileId profileId;
  SlotKey key;
  PropertyId propertyId_local;
  Scope *scope_local;
  FuncInfo *this_local;
  
  local_32 = 0xffff;
  _auStack_30 = scope;
  key.scope._0_4_ = propertyId;
  key._12_4_ = propertyId;
  bVar2 = JsUtil::
          BaseDictionary<FuncInfo::SlotKey,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_FuncInfo::SlotKeyComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<FuncInfo::SlotKey>(&this->slotProfileIdMap,(SlotKey *)auStack_30,&local_32);
  if (!bVar2) {
    bVar2 = Js::ParseableFunctionInfo::IsFunctionParsed(this->byteCodeFunction);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                         ,0x30b,"(this->byteCodeFunction->IsFunctionParsed())",
                         "this->byteCodeFunction->IsFunctionParsed()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_00 = Js::FunctionProxy::GetFunctionBody(&this->byteCodeFunction->super_FunctionProxy);
    bVar2 = Js::FunctionBody::AllocProfiledSlotId(this_00,&local_32);
    if (bVar2) {
      JsUtil::
      BaseDictionary<FuncInfo::SlotKey,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_FuncInfo::SlotKeyComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(&this->slotProfileIdMap,(SlotKey *)auStack_30,&local_32);
    }
  }
  return local_32;
}

Assistant:

Js::ProfileId FindOrAddSlotProfileId(Scope* scope, Js::PropertyId propertyId)
    {
        SlotKey key;

        key.scope = scope;
        key.slot = propertyId;
        Js::ProfileId profileId = Js::Constants::NoProfileId;

        if (!this->slotProfileIdMap.TryGetValue(key, &profileId))
        {
            Assert(this->byteCodeFunction->IsFunctionParsed());
            if (this->byteCodeFunction->GetFunctionBody()->AllocProfiledSlotId(&profileId))
            {
                this->slotProfileIdMap.Add(key, profileId);
            }
        }

        return profileId;
    }